

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O3

uint32_t * pack29_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 - base;
  *out = (in[1] - base) * 0x20000000 | uVar1 - base;
  uVar2 = in[1] - base >> 3;
  out[1] = uVar2;
  out[1] = (in[2] - base) * 0x4000000 | uVar2;
  uVar2 = in[2] - base >> 6;
  out[2] = uVar2;
  out[2] = (in[3] - base) * 0x800000 | uVar2;
  uVar2 = in[3] - base >> 9;
  out[3] = uVar2;
  out[3] = (in[4] - base) * 0x100000 | uVar2;
  uVar2 = in[4] - base >> 0xc;
  out[4] = uVar2;
  out[4] = (in[5] - base) * 0x20000 | uVar2;
  uVar2 = in[5] - base >> 0xf;
  out[5] = uVar2;
  out[5] = (in[6] - base) * 0x4000 | uVar2;
  uVar2 = in[6] - base >> 0x12;
  out[6] = uVar2;
  out[6] = (in[7] - base) * 0x800 | uVar2;
  uVar2 = in[7] - base >> 0x15;
  out[7] = uVar2;
  out[7] = (in[8] - base) * 0x100 | uVar2;
  uVar2 = in[8] - base >> 0x18;
  out[8] = uVar2;
  out[8] = (in[9] - base) * 0x20 | uVar2;
  uVar2 = in[9] - base >> 0x1b;
  out[9] = uVar2;
  uVar2 = (in[10] - base) * 4 | uVar2;
  out[9] = uVar2;
  out[9] = (in[0xb] - base) * -0x80000000 | uVar2;
  uVar2 = in[0xb] - base >> 1;
  out[10] = uVar2;
  out[10] = (in[0xc] - base) * 0x10000000 | uVar2;
  uVar2 = in[0xc] - base >> 4;
  out[0xb] = uVar2;
  out[0xb] = (in[0xd] - base) * 0x2000000 | uVar2;
  uVar2 = in[0xd] - base >> 7;
  out[0xc] = uVar2;
  out[0xc] = (in[0xe] - base) * 0x400000 | uVar2;
  uVar2 = in[0xe] - base >> 10;
  out[0xd] = uVar2;
  out[0xd] = (in[0xf] - base) * 0x80000 | uVar2;
  out[0xe] = in[0xf] - base >> 0xd;
  return out + 0xf;
}

Assistant:

uint32_t * pack29_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  29 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 29  -  26 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  26 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 29  -  23 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  23 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 29  -  20 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  20 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 29  -  17 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  17 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 29  -  14 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  14 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 29  -  11 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  11 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 29  -  8 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 29  -  5 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  5 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 29  -  2 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  2 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  31 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 29  -  28 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  28 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 29  -  25 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  25 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 29  -  22 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  22 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 29  -  19 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  19 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 29  -  16 );
    ++in;

    return out + 1;
}